

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.h
# Opt level: O0

Vector * __thiscall
KDIS::UTILS::Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::operator*
          (Vector *__return_storage_ptr__,
          Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *this,Vector *Value)

{
  float fVar1;
  float fVar2;
  KFLOAT32 *pKVar3;
  ushort local_26;
  ushort local_24;
  KUINT16 j;
  KUINT16 i;
  Vector *Value_local;
  Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *this_local;
  Vector *res;
  
  DATA_TYPE::Vector::Vector(__return_storage_ptr__);
  for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
    for (local_26 = 0; local_26 < 3; local_26 = local_26 + 1) {
      fVar1 = this->Data[local_24][local_26];
      pKVar3 = DATA_TYPE::Vector::operator[](Value,local_26);
      fVar2 = (float)*pKVar3;
      pKVar3 = DATA_TYPE::Vector::operator[](__return_storage_ptr__,local_24);
      *pKVar3 = (KFLOAT32)(fVar1 * fVar2 + (float)*pKVar3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

KDIS::DATA_TYPE::Vector operator * ( const KDIS::DATA_TYPE::Vector& Value )
    {
        KDIS::DATA_TYPE::Vector res;
        for( KUINT16 i = 0; i < rows; ++i )
        {
            for( KUINT16 j = 0; j < cols; ++j )
            {
                res[i] += Data[i][j] * Value[j];
            }
        }

        return res;
    }